

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::BaseRAPass::buildLiveness(BaseRAPass *this)

{
  ZoneAllocator *allocator;
  RAWorkReg RVar1;
  BaseNode BVar2;
  uint uVar3;
  long *plVar4;
  long lVar5;
  RAWorkReg *pRVar6;
  BaseNode *pBVar7;
  FuncNode *pFVar8;
  RABlock *item;
  EVP_PKEY_CTX *pEVar9;
  BaseRAPass *pBVar10;
  bool bVar11;
  BaseNode BVar12;
  Error EVar13;
  int iVar14;
  uint32_t uVar15;
  RABlock **ppRVar16;
  long *plVar17;
  uint *puVar18;
  RAWorkReg **ppRVar19;
  RALiveCount *this_00;
  size_t sVar20;
  uint32_t *puVar21;
  ZoneBitVector *pZVar22;
  RABlock *pRVar23;
  uint uVar24;
  ulong uVar25;
  uint32_t useId;
  Logger *this_01;
  Array<unsigned_int,_4UL> *i;
  uint32_t j;
  ulong uVar26;
  undefined1 *puVar27;
  ZoneBitVector *this_02;
  Array<unsigned_int,_4UL> *pAVar28;
  ulong uVar29;
  size_t sVar30;
  long lVar31;
  uint uVar32;
  EVP_PKEY_CTX *allocator_00;
  float fVar33;
  float __x;
  RegGroup group;
  bool wasOpen;
  Array<unsigned_int,_4UL> *local_368;
  ulong local_360;
  ulong local_358;
  EVP_PKEY_CTX *local_350;
  uint local_344;
  ZoneVector<asmjit::v1_14::RAWorkReg_*> *local_340;
  BaseNode *node;
  RABlock *local_330;
  Logger *local_328;
  BaseRAPass *local_320;
  RABlock *local_318;
  RABlock *local_310;
  RALiveCount curLiveCount;
  ZoneVector<unsigned_int> nInstsPerBlock;
  ZoneVector<unsigned_int> nOutsPerWorkReg;
  ZoneStack<asmjit::v1_14::RABlock_*> workList;
  long local_290;
  RALiveCount maxLiveCount;
  ZoneVector<unsigned_int> nUsesPerWorkReg;
  undefined8 local_258;
  ulong uStack_250;
  undefined8 local_248;
  undefined1 *local_240;
  undefined1 local_238 [520];
  
  if ((this->_diagnosticOptions >> 9 & 1) == 0) {
    this_01 = (Logger *)0x0;
  }
  else {
    this_01 = this->_logger;
  }
  fVar33 = 0.0;
  local_240 = local_238;
  uStack_250 = 0;
  local_258 = 0x20;
  local_248 = 0x207;
  local_238[0] = 0;
  if (this_01 != (Logger *)0x0) {
    fVar33 = Logger::logf(this_01,0.0);
  }
  uVar3 = *(uint *)&this->field_0x148;
  uVar25 = (ulong)uVar3;
  if (uVar25 == 0) {
    if (this_01 == (Logger *)0x0) {
LAB_00121847:
      EVar13 = 0;
    }
    else {
      EVar13 = 0;
      Logger::logf(this_01,fVar33);
    }
    goto LAB_0012184a;
  }
  local_358 = (ulong)*(uint *)&this->field_0xb8;
  uVar32 = *(uint *)&this->field_0xd8;
  _nUsesPerWorkReg = 0;
  _nOutsPerWorkReg = 0;
  _nInstsPerBlock = 0;
  allocator = &this->_allocator;
  EVar13 = ZoneVector<unsigned_int>::resize(&nUsesPerWorkReg,allocator,uVar3);
  if (((EVar13 != 0) ||
      (local_368 = (Array<unsigned_int,_4UL> *)(ulong)uVar32,
      EVar13 = ZoneVector<unsigned_int>::resize(&nOutsPerWorkReg,allocator,uVar3),
      uVar29 = local_358, EVar13 != 0)) ||
     (EVar13 = ZoneVector<unsigned_int>::resize(&nInstsPerBlock,allocator,(uint32_t)local_358),
     EVar13 != 0)) goto LAB_0012184a;
  local_340 = &this->_workRegs;
  local_330 = (RABlock *)CONCAT44(local_330._4_4_,uVar3 + 0x3f >> 6);
  pAVar28 = (Array<unsigned_int,_4UL> *)0x0;
  local_350 = (EVP_PKEY_CTX *)allocator;
  local_328 = this_01;
  local_320 = this;
LAB_00120e1a:
  pBVar10 = local_320;
  pEVar9 = local_350;
  if (pAVar28 != local_368) {
    ppRVar16 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[](&this->_pov,(size_t)pAVar28);
    pRVar23 = *ppRVar16;
    EVar13 = RABlock::resizeLiveBits(pRVar23,uVar3);
    if (EVar13 == 0) {
      plVar4 = *(long **)(pRVar23 + 0x10);
      plVar17 = *(long **)(pRVar23 + 0x18);
      pZVar22 = (ZoneBitVector *)(pRVar23 + 0xa8);
      local_318 = pRVar23 + 0x98;
      uVar32 = 0;
      local_310 = pRVar23;
      do {
        if ((*(byte *)((long)plVar17 + 0x11) & 0x20) != 0) {
          lVar5 = plVar17[4];
          local_344 = uVar32;
          if (lVar5 == 0) {
            DebugUtils::assertionFailed
                      ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/rapass.cpp"
                       ,0x34d,"raInst != nullptr");
          }
          local_360 = (ulong)*(uint *)(lVar5 + 0x10) << 5;
          for (uVar29 = 0; local_360 != uVar29; uVar29 = uVar29 + 0x20) {
            uVar32 = *(uint *)(lVar5 + 0x4c + uVar29);
            uVar26 = (ulong)uVar32;
            puVar18 = ZoneVector<unsigned_int>::operator[](&nUsesPerWorkReg,uVar26);
            *puVar18 = *puVar18 + 1;
            uVar24 = *(uint *)(lVar5 + 0x54 + uVar29);
            puVar18 = ZoneVector<unsigned_int>::operator[](&nOutsPerWorkReg,uVar26);
            *puVar18 = *puVar18 + (uint)((uVar24 >> 1 & 1) != 0);
            bVar11 = ZoneBitVector::bitAt(pZVar22,uVar32);
            if (bVar11) {
              uVar24 = *(uint *)(lVar5 + 0x54 + uVar29) | 0x40000;
LAB_00120f21:
              *(uint *)(lVar5 + 0x54 + uVar29) = uVar24;
            }
            else {
              bVar11 = ZoneBitVector::bitAt((ZoneBitVector *)local_318,uVar32);
              uVar24 = *(uint *)(lVar5 + 0x54 + uVar29);
              if (!bVar11) {
                uVar24 = uVar24 | 0x20000;
                goto LAB_00120f21;
              }
            }
            this_02 = pZVar22;
            if ((uVar24 & 3) != 2) {
              ZoneBitVector::setBit(pZVar22,uVar32,false);
              this_02 = (ZoneBitVector *)local_318;
            }
            ZoneBitVector::setBit(this_02,uVar32,true);
            if ((*(byte *)(lVar5 + 0x55 + uVar29) & 0x10) != 0) {
              ppRVar19 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[](local_340,uVar26);
              *(uint *)(*ppRVar19 + 0x24) = *(uint *)(*ppRVar19 + 0x24) | 0x10;
            }
            uVar26 = (ulong)*(uint *)(lVar5 + 0x50 + uVar29);
            if (uVar26 != 0xffffffff) {
              ppRVar19 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[](local_340,uVar26);
              EVar13 = RAWorkReg::addImmediateConsecutive
                                 (*ppRVar19,(ZoneAllocator *)local_350,uVar32);
              if (EVar13 != 0) goto LAB_0012184a;
            }
          }
          uVar32 = local_344 + 1;
          pRVar23 = local_310;
          uVar29 = local_358;
        }
        if (plVar17 == plVar4) goto LAB_00120fdc;
        plVar17 = (long *)*plVar17;
        if (plVar17 == (long *)0x0) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/rapass.cpp"
                     ,0x37e,"node != nullptr");
        }
      } while( true );
    }
    goto LAB_0012184a;
  }
  workList.super_ZoneStackBase = (ZoneStackBase)0x0;
  workList._1_7_ = 0;
  workList._8_8_ = 0;
  workList._16_8_ = 0;
  curLiveCount.n._data[0] = 0;
  curLiveCount.n._data[1] = 0;
  curLiveCount.n._data[2] = 0;
  curLiveCount.n._data[3] = 0;
  EVar13 = ZoneStack<asmjit::v1_14::RABlock_*>::init(&workList,local_350);
  if ((EVar13 == 0) &&
     (EVar13 = ZoneBitVector::_resize
                         ((ZoneBitVector *)&curLiveCount,(ZoneAllocator *)pEVar9,
                          *(uint32_t *)&pBVar10->field_0xb8,*(uint32_t *)&pBVar10->field_0xb8,true),
     pAVar28 = local_368, EVar13 == 0)) {
    i = (Array<unsigned_int,_4UL> *)0x0;
    uVar15 = (uint32_t)local_330;
LAB_001211d4:
    if (pAVar28 != i) goto code_r0x001211dd;
    while (local_368 = pAVar28, bVar11 = ZoneStackBase::empty(&workList.super_ZoneStackBase),
          !bVar11) {
      pRVar23 = ZoneStack<asmjit::v1_14::RABlock_*>::popFirst
                          ((ZoneStack<asmjit::v1_14::RABlock_*> *)&workList.super_ZoneStackBase);
      ZoneBitVector::setBit((ZoneBitVector *)&curLiveCount,*(uint32_t *)(pRVar23 + 8),false);
      bVar11 = LiveOps::recalcInOut(pRVar23,(uint32_t)local_330,false);
      if (bVar11) {
        uVar3 = *(uint *)(pRVar23 + 0x60);
        for (sVar30 = 0; uVar3 != sVar30; sVar30 = sVar30 + 1) {
          ppRVar16 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[]
                               ((ZoneVector<asmjit::v1_14::RABlock_*> *)(pRVar23 + 0x58),sVar30);
          item = *ppRVar16;
          bVar11 = ZoneBitVector::bitAt((ZoneBitVector *)&curLiveCount,*(uint32_t *)(item + 8));
          if (!bVar11) {
            ZoneBitVector::setBit((ZoneBitVector *)&curLiveCount,*(uint32_t *)(item + 8),true);
            EVar13 = ZoneStack<asmjit::v1_14::RABlock_*>::append
                               ((ZoneStack<asmjit::v1_14::RABlock_*> *)&workList.super_ZoneStackBase
                                ,item);
            if (EVar13 != 0) {
              bVar11 = false;
              uVar29 = local_358;
              goto LAB_0012106a;
            }
          }
        }
      }
      pAVar28 = (Array<unsigned_int,_4UL> *)(ulong)((int)local_368 + 1);
    }
    EVar13 = 0;
    ZoneStackBase::_init(&workList.super_ZoneStackBase,(ZoneAllocator *)0x0,0);
    ZoneBitVector::release((ZoneBitVector *)&curLiveCount,(ZoneAllocator *)local_350);
    bVar11 = true;
    uVar29 = local_358;
    goto LAB_0012106a;
  }
  bVar11 = false;
LAB_0012106a:
  ZoneStackBase::_init(&workList.super_ZoneStackBase,(ZoneAllocator *)0x0,0);
  if (bVar11) {
    if (local_328 != (Logger *)0x0) {
      Logger::logf(local_328,__x);
      for (sVar30 = 0; uVar29 != sVar30; sVar30 = sVar30 + 1) {
        ppRVar16 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[](&this->_blocks,sVar30);
        pRVar23 = *ppRVar16;
        EVar13 = String::_opFormat((String *)&local_258,kAssign,"  {#%u}\n",
                                   (ulong)*(uint *)(pRVar23 + 8));
        if (EVar13 != 0) goto LAB_0012184a;
        _dumpBlockLiveness(local_320,(String *)&local_258,pRVar23);
        uVar29 = local_258 & 0xff;
        puVar27 = (undefined1 *)((long)&local_258 + 1);
        if (0x1e < (local_258 & 0xff)) {
          uVar29 = uStack_250;
          puVar27 = local_240;
        }
        (*local_328->_vptr_Logger[2])(local_328,puVar27,uVar29);
        uVar29 = local_358;
      }
    }
    pEVar9 = local_350;
    sVar30 = 0;
    do {
      allocator_00 = local_350;
      if (uVar25 == sVar30) {
        ZoneVector<unsigned_int>::release(&nUsesPerWorkReg,(ZoneAllocator *)local_350);
        ZoneVector<unsigned_int>::release(&nOutsPerWorkReg,(ZoneAllocator *)allocator_00);
        this_00 = &local_320->_globalMaxLiveCount;
        local_360 = 2;
        sVar30 = 0;
        while( true ) {
          if (sVar30 == uVar29) break;
          ppRVar16 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[](&this->_blocks,sVar30);
          pRVar23 = *ppRVar16;
          if (((byte)pRVar23[0xc] & 2) != 0) {
            local_344 = *(uint *)(pRVar23 + 8);
            node = *(BaseNode **)(pRVar23 + 0x10);
            pBVar7 = *(BaseNode **)(pRVar23 + 0x18);
            puVar18 = ZoneVector<unsigned_int>::operator[](&nInstsPerBlock,sVar30);
            iVar14 = (int)local_360 + *puVar18 * 2;
            *(int *)(pRVar23 + 0x20) = (int)local_360;
            local_318 = (RABlock *)CONCAT44(local_318._4_4_,iVar14);
            *(int *)(pRVar23 + 0x24) = iVar14;
            curLiveCount.n._data[0] = 0;
            curLiveCount.n._data[1] = 0;
            curLiveCount.n._data[2] = 0;
            curLiveCount.n._data[3] = 0;
            maxLiveCount.n._data[0] = 0;
            maxLiveCount.n._data[1] = 0;
            maxLiveCount.n._data[2] = 0;
            maxLiveCount.n._data[3] = 0;
            local_330 = pRVar23;
            ZoneBitVector::ForEachBitSet::ForEachBitSet
                      ((ForEachBitSet *)&workList,(ZoneBitVector *)(pRVar23 + 0x78));
            while (local_290 != 0) {
              sVar20 = Support::BitVectorIterator<unsigned_long>::next
                                 ((BitVectorIterator<unsigned_long> *)&workList);
              ppRVar19 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                                   (local_340,sVar20 & 0xffffffff);
              pRVar6 = *ppRVar19;
              puVar21 = RALiveCount::operator[]
                                  (&curLiveCount,
                                   (RegGroup)((uint)*(undefined4 *)(pRVar6 + 0x20) >> 8) & kMaxValue
                                  );
              *puVar21 = *puVar21 + 1;
              EVar13 = RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_>::openAt
                                 ((RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_>
                                   *)(pRVar6 + 0x50),(ZoneAllocator *)allocator_00,
                                  (uint32_t)local_360,(uint32_t)local_318);
              if (EVar13 != 0) goto LAB_0012184a;
            }
            pZVar22 = (ZoneBitVector *)(local_330 + 0x88);
            while( true ) {
              if (((byte)node[0x11] & 0x20) != 0) {
                lVar5 = *(long *)(node + 0x20);
                if (lVar5 == 0) {
                  DebugUtils::assertionFailed
                            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/rapass.cpp"
                             ,0x3f0,"raInst != nullptr");
                }
                uVar3 = *(uint *)(lVar5 + 0x10);
                *(int *)(node + 0x14) = (int)local_360;
                local_310 = (RABlock *)(lVar5 + 0x1c);
                *(undefined8 *)(lVar5 + 0x1c) = curLiveCount.n._data._0_8_;
                *(undefined8 *)(lVar5 + 0x24) = curLiveCount.n._data._8_8_;
                local_368 = (Array<unsigned_int,_4UL> *)(lVar5 + 0x3c);
                for (lVar31 = 0; (ulong)uVar3 << 5 != lVar31; lVar31 = lVar31 + 0x20) {
                  uVar32 = *(uint *)(lVar5 + 0x4c + lVar31);
                  ppRVar19 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                                       (local_340,(ulong)uVar32);
                  pRVar6 = *ppRVar19;
                  ZoneVector<asmjit::v1_14::BaseNode_*>::appendUnsafe
                            ((ZoneVector<asmjit::v1_14::BaseNode_*> *)(pRVar6 + 0x70),&node);
                  if ((*(byte *)(lVar5 + 0x54 + lVar31) & 2) != 0) {
                    ZoneVector<asmjit::v1_14::BaseNode_*>::appendUnsafe
                              ((ZoneVector<asmjit::v1_14::BaseNode_*> *)(pRVar6 + 0x80),&node);
                  }
                  if (*(uint *)(pRVar6 + 0x28) != local_344) {
                    *(undefined4 *)(pRVar6 + 0x28) = 0xffffffff;
                    pRVar6[0x24] = (RAWorkReg)((byte)pRVar6[0x24] | 4);
                  }
                  uVar24 = *(uint *)(lVar5 + 0x54 + lVar31);
                  if ((uVar24 >> 0x11 & 1) != 0) {
                    bVar11 = ZoneBitVector::bitAt(pZVar22,uVar32);
                    uVar24 = *(uint *)(lVar5 + 0x54 + lVar31);
                    if (!bVar11) {
                      uVar24 = uVar24 | 0x40000;
                      *(uint *)(lVar5 + 0x54 + lVar31) = uVar24;
                    }
                  }
                  EVar13 = RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_>::
                           openAt((RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_>
                                   *)(pRVar6 + 0x50),(ZoneAllocator *)local_350,
                                  (~uVar24 & 1) + (int)local_360,(uint32_t)local_318,&wasOpen);
                  if (EVar13 != 0) goto LAB_0012184a;
                  group = (byte)pRVar6[0x21] & kMaxValue;
                  if (wasOpen == false) {
                    puVar21 = RALiveCount::operator[](&curLiveCount,group);
                    *puVar21 = *puVar21 + 1;
                    puVar21 = RALiveCount::operator[]((RALiveCount *)local_310,group);
                    *puVar21 = *puVar21 + 1;
                  }
                  uVar32 = *(uint *)(lVar5 + 0x54 + lVar31);
                  if ((uVar32 >> 0x12 & 1) != 0) {
                    RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_>::closeAt
                              ((RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_>
                                *)(pRVar6 + 0x50),(int)local_360 - (uVar32 | 0xfffffffe));
                    puVar21 = RALiveCount::operator[](&curLiveCount,group);
                    *puVar21 = *puVar21 - 1;
                  }
                  RVar1 = *(RAWorkReg *)(lVar5 + 0x5a + lVar31);
                  if (RVar1 != (RAWorkReg)0xff) {
                    uVar32 = 1 << ((byte)RVar1 & 0x1f);
                    *(uint *)(pRVar6 + 0x2c) = *(uint *)(pRVar6 + 0x2c) | uVar32;
                    if ((pRVar6[0x4b] == (RAWorkReg)0xff) &&
                       (puVar18 = Support::Array<unsigned_int,_4UL>::
                                  operator[]<asmjit::v1_14::RegGroup>(local_368,&group),
                       (*puVar18 & uVar32) == 0)) {
                      pRVar6[0x4b] = RVar1;
                    }
                  }
                  uVar32 = *(uint *)(lVar5 + 0x5c + lVar31);
                  if ((uVar32 != 0) &&
                     (*(uint *)(pRVar6 + 0x30) = *(uint *)(pRVar6 + 0x30) & uVar32,
                     ((byte)pRVar6[0x24] & 0x10) != 0)) {
                    *(uint *)(pRVar6 + 0x34) = *(uint *)(pRVar6 + 0x34) & uVar32;
                  }
                  uVar32 = *(uint *)(lVar5 + 0x60 + lVar31);
                  if ((uVar32 != 0) &&
                     (*(uint *)(pRVar6 + 0x30) = *(uint *)(pRVar6 + 0x30) & uVar32,
                     ((byte)pRVar6[0x24] & 0x10) != 0)) {
                    *(uint *)(pRVar6 + 0x34) = *(uint *)(pRVar6 + 0x34) & uVar32;
                  }
                  puVar18 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                                      (local_368,&group);
                  if ((*puVar18 != 0) && ((*(uint *)(lVar5 + 0x54 + lVar31) & 0x40008) == 0)) {
                    puVar18 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                                        (local_368,&group);
                    *(uint *)(pRVar6 + 0x38) = *(uint *)(pRVar6 + 0x38) | *puVar18;
                  }
                }
                if (node[0x10] == (BaseNode)0x12) {
                  pFVar8 = local_320->_func;
                  BVar2 = (BaseNode)(pFVar8->_frame)._callStackAlignment;
                  BVar12 = node[0x85];
                  if ((byte)node[0x85] < (byte)BVar2) {
                    BVar12 = BVar2;
                  }
                  (pFVar8->_frame)._callStackAlignment = (uint8_t)BVar12;
                  BVar2 = (BaseNode)(pFVar8->_frame)._finalStackAlignment;
                  if ((byte)BVar12 < (byte)BVar2) {
                    BVar12 = BVar2;
                  }
                  (pFVar8->_frame)._finalStackAlignment = (uint8_t)BVar12;
                }
                local_360 = (ulong)((int)local_360 + 2);
                Support::Array<unsigned_int,_4UL>::combine<asmjit::v1_14::Support::Max>
                          (&maxLiveCount.n,(Array<unsigned_int,_4UL> *)local_310);
              }
              pRVar23 = local_330;
              if (node == pBVar7) break;
              node = *(BaseNode **)(node + 8);
              if (node == (BaseNode *)0x0) {
                DebugUtils::assertionFailed
                          ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/rapass.cpp"
                           ,0x446,"node != nullptr");
              }
            }
            *(undefined8 *)(local_330 + 0x34) = maxLiveCount.n._data._0_8_;
            *(undefined8 *)(local_330 + 0x3c) = maxLiveCount.n._data._8_8_;
            Support::Array<unsigned_int,_4UL>::combine<asmjit::v1_14::Support::Max>
                      (&this_00->n,&maxLiveCount.n);
            uVar29 = local_358;
            allocator_00 = local_350;
            if ((int)local_360 != *(int *)(pRVar23 + 0x24)) {
              DebugUtils::assertionFailed
                        ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/rapass.cpp"
                         ,1099,"position == block->endPosition()");
            }
          }
          sVar30 = sVar30 + 1;
        }
        for (sVar30 = 0; uVar25 != sVar30; sVar30 = sVar30 + 1) {
          ppRVar19 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[](local_340,sVar30);
          pRVar6 = *ppRVar19;
          uVar15 = RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_>::width
                             ((RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *
                              )(pRVar6 + 0x50));
          if (uVar15 == 0) {
            fVar33 = 0.0;
          }
          else {
            fVar33 = (float)((double)*(uint *)(pRVar6 + 0x78) / (double)uVar15);
          }
          *(uint32_t *)(pRVar6 + 0x60) = uVar15;
          *(float *)(pRVar6 + 100) = fVar33;
          *(float *)(pRVar6 + 0x68) = (float)*(byte *)(*(long *)(pRVar6 + 8) + 0xe) * 0.01 + fVar33;
        }
        if (local_328 != (Logger *)0x0) {
          String::clear((String *)&local_258);
          _dumpLiveSpans(local_320,(String *)&local_258);
          uVar25 = uStack_250;
          puVar27 = local_240;
          if ((local_258 & 0xff) < 0x1f) {
            uVar25 = local_258 & 0xff;
            puVar27 = (undefined1 *)((long)&local_258 + 1);
          }
          (*local_328->_vptr_Logger[2])(local_328,puVar27,uVar25);
        }
        ZoneVector<unsigned_int>::release(&nInstsPerBlock,(ZoneAllocator *)local_350);
        goto LAB_00121847;
      }
      ppRVar19 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[](local_340,sVar30);
      pRVar6 = *ppRVar19;
      puVar18 = ZoneVector<unsigned_int>::operator[](&nUsesPerWorkReg,sVar30);
      EVar13 = ZoneVector<asmjit::v1_14::BaseNode_*>::reserve
                         ((ZoneVector<asmjit::v1_14::BaseNode_*> *)(pRVar6 + 0x70),
                          (ZoneAllocator *)pEVar9,*puVar18);
      if (EVar13 != 0) break;
      puVar18 = ZoneVector<unsigned_int>::operator[](&nOutsPerWorkReg,sVar30);
      EVar13 = ZoneVector<asmjit::v1_14::BaseNode_*>::reserve
                         ((ZoneVector<asmjit::v1_14::BaseNode_*> *)(pRVar6 + 0x80),
                          (ZoneAllocator *)pEVar9,*puVar18);
      sVar30 = sVar30 + 1;
      uVar29 = local_358;
    } while (EVar13 == 0);
  }
LAB_0012184a:
  String::reset((String *)&local_258);
  return EVar13;
LAB_00120fdc:
  puVar18 = ZoneVector<unsigned_int>::operator[](&nInstsPerBlock,(ulong)*(uint *)(pRVar23 + 8));
  *puVar18 = uVar32;
  pAVar28 = (Array<unsigned_int,_4UL> *)((long)pAVar28->_data + 1);
  goto LAB_00120e1a;
code_r0x001211dd:
  ppRVar16 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[](&this->_pov,(size_t)i);
  pRVar23 = *ppRVar16;
  LiveOps::recalcInOut(pRVar23,uVar15,true);
  EVar13 = ZoneStack<asmjit::v1_14::RABlock_*>::append(&workList,pRVar23);
  i = (Array<unsigned_int,_4UL> *)((long)i->_data + 1);
  if (EVar13 != 0) goto code_r0x0012120b;
  goto LAB_001211d4;
code_r0x0012120b:
  bVar11 = false;
  uVar29 = local_358;
  goto LAB_0012106a;
}

Assistant:

ASMJIT_FAVOR_SPEED Error BaseRAPass::buildLiveness() noexcept {
#ifndef ASMJIT_NO_LOGGING
  Logger* logger = getLoggerIf(DiagnosticOptions::kRADebugLiveness);
  StringTmp<512> sb;
#endif

  ASMJIT_RA_LOG_FORMAT("[BuildLiveness]\n");

  uint32_t i;

  uint32_t numAllBlocks = blockCount();
  uint32_t numReachableBlocks = reachableBlockCount();

  uint32_t numWorkRegs = workRegCount();
  uint32_t numBitWords = ZoneBitVector::_wordsPerBits(numWorkRegs);

  if (!numWorkRegs) {
    ASMJIT_RA_LOG_FORMAT("  Done (no virtual registers)\n");
    return kErrorOk;
  }

  ZoneVector<uint32_t> nUsesPerWorkReg; // Number of USEs of each RAWorkReg.
  ZoneVector<uint32_t> nOutsPerWorkReg; // Number of OUTs of each RAWorkReg.
  ZoneVector<uint32_t> nInstsPerBlock;  // Number of instructions of each RABlock.

  ASMJIT_PROPAGATE(nUsesPerWorkReg.resize(allocator(), numWorkRegs));
  ASMJIT_PROPAGATE(nOutsPerWorkReg.resize(allocator(), numWorkRegs));
  ASMJIT_PROPAGATE(nInstsPerBlock.resize(allocator(), numAllBlocks));

  // Calculate GEN/KILL of Each Block
  // --------------------------------

  for (i = 0; i < numReachableBlocks; i++) {
    RABlock* block = _pov[i];
    ASMJIT_PROPAGATE(block->resizeLiveBits(numWorkRegs));

    BaseNode* node = block->last();
    BaseNode* stop = block->first();

    uint32_t nInsts = 0;
    for (;;) {
      if (node->isInst()) {
        InstNode* inst = node->as<InstNode>();
        RAInst* raInst = inst->passData<RAInst>();
        ASMJIT_ASSERT(raInst != nullptr);

        RATiedReg* tiedRegs = raInst->tiedRegs();
        uint32_t count = raInst->tiedCount();

        for (uint32_t j = 0; j < count; j++) {
          RATiedReg* tiedReg = &tiedRegs[j];
          uint32_t workId = tiedReg->workId();

          // Update `nUses` and `nOuts`.
          nUsesPerWorkReg[workId] += 1u;
          nOutsPerWorkReg[workId] += uint32_t(tiedReg->isWrite());

          // Mark as:
          //   KILL - if this VirtReg is killed afterwards.
          //   LAST - if this VirtReg is last in this basic block.
          if (block->kill().bitAt(workId))
            tiedReg->addFlags(RATiedFlags::kKill);
          else if (!block->gen().bitAt(workId))
            tiedReg->addFlags(RATiedFlags::kLast);

          if (tiedReg->isWriteOnly()) {
            // KILL.
            block->kill().setBit(workId, true);
          }
          else {
            // GEN.
            block->kill().setBit(workId, false);
            block->gen().setBit(workId, true);
          }

          if (tiedReg->isLeadConsecutive()) {
            RAWorkReg* workReg = workRegById(workId);
            workReg->markLeadConsecutive();
          }

          if (tiedReg->hasConsecutiveParent()) {
            RAWorkReg* consecutiveParentReg = workRegById(tiedReg->consecutiveParent());
            ASMJIT_PROPAGATE(consecutiveParentReg->addImmediateConsecutive(allocator(), workId));
          }
        }

        nInsts++;
      }

      if (node == stop)
        break;

      node = node->prev();
      ASMJIT_ASSERT(node != nullptr);
    }

    nInstsPerBlock[block->blockId()] = nInsts;
  }

  // Calculate IN/OUT of Each Block
  // ------------------------------

#ifndef ASMJIT_NO_LOGGING
  uint32_t numVisits = numReachableBlocks;
#endif

  {
    ZoneStack<RABlock*> workList;
    ZoneBitVector workBits;

    ASMJIT_PROPAGATE(workList.init(allocator()));
    ASMJIT_PROPAGATE(workBits.resize(allocator(), blockCount(), true));

    for (i = 0; i < numReachableBlocks; i++) {
      RABlock* block = _pov[i];
      LiveOps::recalcInOut(block, numBitWords, true);
      ASMJIT_PROPAGATE(workList.append(block));
    }

    while (!workList.empty()) {
      RABlock* block = workList.popFirst();
      uint32_t blockId = block->blockId();

      workBits.setBit(blockId, false);
      if (LiveOps::recalcInOut(block, numBitWords)) {
        const RABlocks& predecessors = block->predecessors();
        uint32_t numPredecessors = predecessors.size();

        for (uint32_t j = 0; j < numPredecessors; j++) {
          RABlock* pred = predecessors[j];
          if (!workBits.bitAt(pred->blockId())) {
            workBits.setBit(pred->blockId(), true);
            ASMJIT_PROPAGATE(workList.append(pred));
          }
        }
      }
#ifndef ASMJIT_NO_LOGGING
      numVisits++;
#endif
    }

    workList.reset();
    workBits.release(allocator());
  }

  ASMJIT_RA_LOG_COMPLEX({
    logger->logf("  LiveIn/Out Done (%u visits)\n", numVisits);
    for (i = 0; i < numAllBlocks; i++) {
      RABlock* block = _blocks[i];

      ASMJIT_PROPAGATE(sb.assignFormat("  {#%u}\n", block->blockId()));
      ASMJIT_PROPAGATE(_dumpBlockLiveness(sb, block));

      logger->log(sb);
    }
  });

  // Reserve the space in each `RAWorkReg` for references
  // ----------------------------------------------------

  for (i = 0; i < numWorkRegs; i++) {
    RAWorkReg* workReg = workRegById(i);
    ASMJIT_PROPAGATE(workReg->_refs.reserve(allocator(), nUsesPerWorkReg[i]));
    ASMJIT_PROPAGATE(workReg->_writes.reserve(allocator(), nOutsPerWorkReg[i]));
  }

  // These are not needed anymore, so release the memory now so other allocations can reuse it.
  nUsesPerWorkReg.release(allocator());
  nOutsPerWorkReg.release(allocator());

  // Assign block and instruction positions, build LiveCount and LiveSpans
  // ---------------------------------------------------------------------

  // This is a starting position, reserving [0, 1] for function arguments.
  uint32_t position = 2;

  for (i = 0; i < numAllBlocks; i++) {
    RABlock* block = _blocks[i];
    if (!block->isReachable())
      continue;

    uint32_t blockId = block->blockId();

    BaseNode* node = block->first();
    BaseNode* stop = block->last();

    uint32_t endPosition = position + nInstsPerBlock[i] * 2;
    block->setFirstPosition(position);
    block->setEndPosition(endPosition);

    RALiveCount curLiveCount;
    RALiveCount maxLiveCount;

    // Process LIVE-IN.
    ZoneBitVector::ForEachBitSet it(block->liveIn());
    while (it.hasNext()) {
      RAWorkReg* workReg = _workRegs[uint32_t(it.next())];
      curLiveCount[workReg->group()]++;
      ASMJIT_PROPAGATE(workReg->liveSpans().openAt(allocator(), position, endPosition));
    }

    for (;;) {
      if (node->isInst()) {
        InstNode* inst = node->as<InstNode>();
        RAInst* raInst = inst->passData<RAInst>();

        // Impossible - each processed instruction node must have an associated RAInst.
        ASMJIT_ASSERT(raInst != nullptr);

        RATiedReg* tiedRegs = raInst->tiedRegs();
        uint32_t count = raInst->tiedCount();

        inst->setPosition(position);
        raInst->_liveCount = curLiveCount;

        for (uint32_t j = 0; j < count; j++) {
          RATiedReg* tiedReg = &tiedRegs[j];
          uint32_t workId = tiedReg->workId();

          // Create refs and writes.
          RAWorkReg* workReg = workRegById(workId);
          workReg->_refs.appendUnsafe(node);
          if (tiedReg->isWrite()) {
            workReg->_writes.appendUnsafe(node);
          }

          if (workReg->singleBasicBlockId() != blockId) {
            workReg->markUseOfMultipleBasicBlocks();
          }

          // We couldn't calculate this in previous steps, but since we know all LIVE-OUT at this point it becomes
          // trivial. If this is the last instruction that uses this `workReg` and it's not LIVE-OUT then it is
          // KILLed here.
          if (tiedReg->isLast() && !block->liveOut().bitAt(workId)) {
            tiedReg->addFlags(RATiedFlags::kKill);
          }

          LiveRegSpans& liveSpans = workReg->liveSpans();
          bool wasOpen;
          ASMJIT_PROPAGATE(liveSpans.openAt(allocator(), position + !tiedReg->isRead(), endPosition, wasOpen));

          RegGroup group = workReg->group();
          if (!wasOpen) {
            curLiveCount[group]++;
            raInst->_liveCount[group]++;
          }

          if (tiedReg->isKill()) {
            liveSpans.closeAt(position + !tiedReg->isRead() + 1);
            curLiveCount[group]--;
          }

          // Update `RAWorkReg::useIdMask` and `RAWorkReg::hintRegId`.
          if (tiedReg->hasUseId()) {
            uint32_t useId = tiedReg->useId();
            workReg->addUseIdMask(Support::bitMask(useId));
            if (!workReg->hasHintRegId() && !Support::bitTest(raInst->_clobberedRegs[group], useId)) {
              workReg->setHintRegId(useId);
            }
          }

          if (tiedReg->useRegMask()) {
            workReg->restrictPreferredMask(tiedReg->useRegMask());
            if (workReg->isLeadConsecutive()) {
              workReg->restrictConsecutiveMask(tiedReg->useRegMask());
            }
          }

          if (tiedReg->outRegMask()) {
            workReg->restrictPreferredMask(tiedReg->outRegMask());
            if (workReg->isLeadConsecutive()) {
              workReg->restrictConsecutiveMask(tiedReg->outRegMask());
            }
          }

          // Update `RAWorkReg::clobberedSurvivalMask`.
          if (raInst->_clobberedRegs[group] && !tiedReg->isOutOrKill()) {
            workReg->addClobberSurvivalMask(raInst->_clobberedRegs[group]);
          }
        }

        if (node->isInvoke()) {
          func()->frame().updateCallStackAlignment(node->as<InvokeNode>()->detail().naturalStackAlignment());
        }

        position += 2;
        maxLiveCount.op<Support::Max>(raInst->_liveCount);
      }

      if (node == stop)
        break;

      node = node->next();
      ASMJIT_ASSERT(node != nullptr);
    }

    block->_maxLiveCount = maxLiveCount;
    _globalMaxLiveCount.op<Support::Max>(maxLiveCount);
    ASMJIT_ASSERT(position == block->endPosition());
  }

  // Calculate WorkReg statistics
  // ----------------------------

  for (i = 0; i < numWorkRegs; i++) {
    RAWorkReg* workReg = _workRegs[i];

    LiveRegSpans& spans = workReg->liveSpans();
    uint32_t width = spans.width();
    float freq = width ? float(double(workReg->_refs.size()) / double(width)) : float(0);

    RALiveStats& stats = workReg->liveStats();
    stats._width = width;
    stats._freq = freq;
    stats._priority = freq + float(int(workReg->virtReg()->weight())) * 0.01f;
  }

  ASMJIT_RA_LOG_COMPLEX({
    sb.clear();
    _dumpLiveSpans(sb);
    logger->log(sb);
  });

  nInstsPerBlock.release(allocator());

  return kErrorOk;
}